

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::peer_blocked_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_blocked_alert *this)

{
  undefined8 uVar1;
  allocator<char> local_299;
  string local_298;
  char local_278 [8];
  char ret [600];
  peer_blocked_alert *this_local;
  
  peer_alert::message_abi_cxx11_(&local_298,&this->super_peer_alert);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(local_278,600,"%s: blocked peer [%s]",uVar1,
           message::reason_str[*(int *)&(this->super_peer_alert).field_0x9c]);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,&local_299);
  std::allocator<char>::~allocator(&local_299);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_blocked_alert::message() const
	{
		char ret[600];
		static char const* const reason_str[] =
		{
			"ip_filter",
			"port_filter",
			"i2p_mixed",
			"privileged_ports",
			"utp_disabled",
			"tcp_disabled",
			"invalid_local_interface"
		};

		std::snprintf(ret, sizeof(ret), "%s: blocked peer [%s]"
			, peer_alert::message().c_str(), reason_str[reason]);
		return ret;
	}